

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O0

bool __thiscall ShParser::parseParameters(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  char cVar1;
  undefined8 uVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  Token *pTVar6;
  Identifier *this_00;
  string *psVar7;
  char *pcVar8;
  char **ppcVar9;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Identifier *local_58;
  Identifier *identifier;
  size_t length;
  Token *pTStack_40;
  bool skip;
  Token *token;
  char **fReg;
  char *encoding;
  tShOpcode *opcode_local;
  Parser *parser_local;
  ShParser *this_local;
  
  fReg = (char **)opcode->encoding;
  (this->immediate).primary.type = None;
  encoding = (char *)opcode;
  opcode_local = (tShOpcode *)parser;
  parser_local = (Parser *)this;
LAB_001e31d5:
  if (*(char *)fReg == '\0') {
    (this->opcodeData).opcode.name = *(char **)encoding;
    (this->opcodeData).opcode.encoding = *(char **)(encoding + 8);
    uVar2 = *(undefined8 *)(encoding + 0x10);
    (this->opcodeData).opcode.base = (short)uVar2;
    *(short *)&(this->opcodeData).opcode.field_0x12 = (short)((ulong)uVar2 >> 0x10);
    (this->opcodeData).opcode.format = (int)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)(encoding + 0x18);
    (this->opcodeData).opcode.archs = (int)uVar2;
    (this->opcodeData).opcode.flags = (int)((ulong)uVar2 >> 0x20);
    pTVar6 = Parser::nextToken((Parser *)opcode_local);
    return pTVar6->type == Separator;
  }
  if ((*(uint *)(encoding + 0x1c) & 8) != 0) {
    token = (Token *)shSpecialForcedRegisters;
    pTStack_40 = Parser::peekToken((Parser *)opcode_local,0);
    length._7_1_ = 0;
    for (; token->line != 0; token = (Token *)&token->column) {
      identifier = (Identifier *)strlen((char *)token->line);
      iVar5 = memcmp((void *)token->line,fReg,(size_t)identifier);
      if (iVar5 == 0) {
        if (pTStack_40->type == Identifier) {
          local_58 = Token::identifierValue(pTStack_40);
          psVar7 = Identifier::string_abi_cxx11_(local_58);
          pcVar8 = (char *)token->line;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar8,&local_79);
          _Var3 = std::operator==(psVar7,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::allocator<char>::~allocator(&local_79);
          if (_Var3) {
            length._7_1_ = 1;
            fReg = (char **)(&(identifier->_name)._M_dataplus + (long)fReg);
            Parser::eatToken((Parser *)opcode_local);
          }
        }
        break;
      }
    }
    if ((length._7_1_ & 1) != 0) goto LAB_001e31d5;
  }
  ppcVar9 = (char **)((long)fReg + 1);
  cVar1 = *(char *)fReg;
  if (cVar1 == '@') {
    fReg = ppcVar9;
    pTVar6 = Parser::peekToken((Parser *)opcode_local,0);
    if (pTVar6->type != Identifier) {
      return false;
    }
    pTVar6 = Parser::peekToken((Parser *)opcode_local,0);
    this_00 = Token::identifierValue(pTVar6);
    psVar7 = Identifier::string_abi_cxx11_(this_00);
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psVar7);
    if (*pcVar8 != '@') {
      return false;
    }
    if (*(char *)fReg == 't') {
      bVar4 = parseRegister(this,(Parser *)opcode_local,&(this->registers).grt);
      if (!bVar4) {
        return false;
      }
    }
    else if (*(char *)fReg == 's') {
      bVar4 = parseRegister(this,(Parser *)opcode_local,(ShRegisterValue *)this);
      if (!bVar4) {
        return false;
      }
    }
    else {
      if ((*(char *)fReg != '(') && (*(char *)fReg != '-')) {
        return false;
      }
      Parser::eatToken((Parser *)opcode_local);
      bVar4 = matchSymbol(this,(Parser *)opcode_local,*(char *)fReg);
      if (!bVar4) {
        return false;
      }
    }
    fReg = (char **)((long)fReg + 1);
  }
  else if (cVar1 == 'i') {
    fReg = ppcVar9;
    bVar4 = parseImmediate(this,(Parser *)opcode_local,&(this->immediate).primary.expression);
    if (!bVar4) {
      return false;
    }
    bVar4 = decodeImmediateSize((char **)&fReg,(ShImmediateType *)&this->immediate);
    if (!bVar4) {
      return false;
    }
  }
  else if (cVar1 == 's') {
    fReg = ppcVar9;
    bVar4 = parseRegister(this,(Parser *)opcode_local,(ShRegisterValue *)this);
    if (!bVar4) {
      return false;
    }
  }
  else if (cVar1 == 't') {
    fReg = ppcVar9;
    bVar4 = parseRegister(this,(Parser *)opcode_local,&(this->registers).grt);
    if (!bVar4) {
      return false;
    }
  }
  else {
    cVar1 = *(char *)fReg;
    fReg = ppcVar9;
    bVar4 = matchSymbol(this,(Parser *)opcode_local,cVar1);
    if (!bVar4) {
      return false;
    }
  }
  goto LAB_001e31d5;
}

Assistant:

bool ShParser::parseParameters(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = ShImmediateType::None;

	while (*encoding != 0)
	{
		// Some registers in instructions are forced
		// and do not have a numerical representation (except for r0.)
		// This handles said forced registers.
		if (opcode.flags & SH_FREG)
		{
			const char **fReg = shSpecialForcedRegisters;
			const Token &token = parser.peekToken();
			bool skip = false;
			while (*fReg)
			{
				size_t length = strlen(*fReg);
				if (memcmp(*fReg, encoding, length) == 0)
				{
					if (token.type != TokenType::Identifier)
						break;

					const auto &identifier = token.identifierValue();
					if (identifier.string() == std::string(*fReg))
					{
						skip = true;
						encoding += length;
						parser.eatToken();
						break;
					}
					break;
				}
				fReg += 1;
			}
			if (skip)
				continue;
		}

		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case '@':
			// '@' is not a separate token, and at the same time it's
			// part of the SuperH instruction parameter scheme,
			// so I came up with this rather ugly solution to handle it. 
			if (parser.peekToken().type != TokenType::Identifier)
				return false;
			if (parser.peekToken().identifierValue().string()[0] != '@')
				return false;
			if (*encoding == 't')
			{
				CHECK(parseRegister(parser,registers.grt));
			}
			else if (*encoding == 's')
			{
				CHECK(parseRegister(parser,registers.grs));
			}
			else if (*encoding == '(' || *encoding == '-') // "mov.* r0,@(i4,t)", "mov.* s,@-t" and the others
			{
				parser.eatToken();
				CHECK(matchSymbol(parser, *encoding));
			}
			else
			{
				return false;
			}
			encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}